

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulateutil.cc
# Opt level: O1

void __thiscall EmulateSnippet::executeBranchind(EmulateSnippet *this)

{
  LowlevelError *this_00;
  char *pcVar1;
  long *plVar2;
  size_type *psVar3;
  allocator local_61;
  string local_60;
  string local_40 [32];
  
  this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
  pcVar1 = get_opname(this->currentOp->behave->opcode);
  std::__cxx11::string::string(local_40,pcVar1,&local_61);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)local_40,0,(char *)0x0,0x345470);
  local_60._M_dataplus._M_p = (pointer)*plVar2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_60._M_dataplus._M_p == psVar3) {
    local_60.field_2._M_allocated_capacity = *psVar3;
    local_60.field_2._8_8_ = plVar2[3];
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  }
  else {
    local_60.field_2._M_allocated_capacity = *psVar3;
  }
  local_60._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  LowlevelError::LowlevelError(this_00,&local_60);
  __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
}

Assistant:

void EmulateSnippet::executeBranchind(void)

{
  throw LowlevelError("Illegal p-code operation in snippet: "+ (string)get_opname(currentOp->getOpcode()));
}